

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::CategoricalDistributionLayerParams::SerializeWithCachedSizes
          (CategoricalDistributionLayerParams *this,CodedOutputStream *output)

{
  float fVar1;
  
  if (this->seed_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt64(1,this->seed_,output);
  }
  if (this->numsamples_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt64(2,this->numsamples_,output);
  }
  if (this->islogits_ == true) {
    google::protobuf::internal::WireFormatLite::WriteBool(3,true,output);
  }
  fVar1 = this->eps_;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    google::protobuf::internal::WireFormatLite::WriteFloat(4,fVar1,output);
  }
  fVar1 = this->temperature_;
  if ((fVar1 == 0.0) && (!NAN(fVar1))) {
    return;
  }
  google::protobuf::internal::WireFormatLite::WriteFloat(5,fVar1,output);
  return;
}

Assistant:

void CategoricalDistributionLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.CategoricalDistributionLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 seed = 1;
  if (this->seed() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(1, this->seed(), output);
  }

  // int64 numSamples = 2;
  if (this->numsamples() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(2, this->numsamples(), output);
  }

  // bool isLogits = 3;
  if (this->islogits() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(3, this->islogits(), output);
  }

  // float eps = 4;
  if (this->eps() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(4, this->eps(), output);
  }

  // float temperature = 5;
  if (this->temperature() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(5, this->temperature(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.CategoricalDistributionLayerParams)
}